

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

RepeatedPtrFieldBase *
google::protobuf::Arena::CreateArenaCompatible<google::protobuf::internal::RepeatedPtrFieldBase>
          (Arena *arena)

{
  RepeatedPtrFieldBase *pRVar1;
  
  if (arena != (Arena *)0x0) {
    pRVar1 = (RepeatedPtrFieldBase *)Allocate(arena,0x18);
    pRVar1->tagged_rep_or_elem_ = (void *)0x0;
    pRVar1->current_size_ = 0;
    pRVar1->capacity_proxy_ = 0;
    pRVar1->arena_ = arena;
    return pRVar1;
  }
  pRVar1 = (RepeatedPtrFieldBase *)operator_new(0x18);
  pRVar1->tagged_rep_or_elem_ = (void *)0x0;
  pRVar1->current_size_ = 0;
  pRVar1->capacity_proxy_ = 0;
  pRVar1->arena_ = (Arena *)0x0;
  return pRVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateArenaCompatible(Arena* arena) {
    static_assert(is_arena_constructable<T>::value,
                  "Can only construct types that are ArenaConstructable");
    if (PROTOBUF_PREDICT_FALSE(arena == nullptr)) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }